

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vstat.cc
# Opt level: O1

int main(int argc,char **argv)

{
  OutputFormats OVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined7 uVar7;
  ostream *this;
  size_t sVar6;
  int iVar8;
  undefined4 uVar9;
  char *pcVar10;
  int iVar11;
  char **ppcVar12;
  byte bVar13;
  string *psVar14;
  int vector_length;
  int output_interval;
  int num_data;
  double confidence_level;
  vector<const_char_*,_std::allocator<const_char_*>_> statistics_file;
  double num_data_1;
  StatisticsAccumulation accumulation;
  ostringstream error_message_8;
  vector<double,_std::allocator<double>_> tmp_1;
  vector<double,_std::allocator<double>_> first;
  int tmp;
  vector<double,_std::allocator<double>_> data;
  ifstream ifs;
  Buffer buffer;
  int local_738;
  byte local_731;
  OutputFormats local_730;
  int local_72c;
  undefined8 local_728;
  string local_720;
  string *local_700;
  string *local_6f8;
  undefined8 local_6f0;
  char **local_6e8;
  iterator iStack_6e0;
  char **local_6d8;
  char **local_6d0;
  double local_6c8;
  StatisticsAccumulation local_6c0;
  string local_6a8;
  byte abStack_688 [80];
  ios_base local_638 [408];
  vector<double,_std::allocator<double>_> local_4a0;
  vector<double,_std::allocator<double>_> local_488;
  string local_470 [3];
  ios_base local_400 [264];
  SymmetricMatrix local_2f8;
  string local_2b8;
  byte abStack_298 [80];
  ios_base local_248 [408];
  Buffer local_b0;
  
  local_738 = 1;
  local_72c = -1;
  local_6f8 = (string *)0x4057c00000000000;
  local_6e8 = (char **)0x0;
  iStack_6e0._M_current = (char **)0x0;
  local_6d8 = (char **)0x0;
  local_728 = 0;
  local_6f0 = 0;
  local_730 = kMeanAndCovariance;
  iVar11 = 0;
  do {
    iVar5 = ya_getopt_long(argc,argv,"l:m:t:c:o:s:deh",(option *)0x0,(int *)0x0);
    uVar7 = (undefined7)
            ((ulong)((long)&switchD_001038d8::switchdataD_00110020 +
                    (long)(int)(&switchD_001038d8::switchdataD_00110020)[iVar5 - 99]) >> 8);
    switch(iVar5) {
    case 99:
      std::__cxx11::string::string((string *)&local_2b8,ya_optarg,(allocator *)&local_6a8);
      bVar2 = sptk::ConvertStringToDouble(&local_2b8,(double *)&local_6f8);
      if (!bVar2 || (double)local_6f8 <= 0.0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
      }
      else {
        psVar14 = local_6f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          local_700 = local_6f8;
          operator_delete(local_2b8._M_dataplus._M_p);
          psVar14 = local_700;
        }
        if ((double)psVar14 < 100.0) goto LAB_00103e6f;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b8,"The argument for the -c option must be a number ",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b8,"in the open interval (0, 100)",0x1d);
      local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"vstat","");
      sptk::PrintErrorMessage(&local_6a8,(ostringstream *)&local_2b8);
      goto LAB_00103e1c;
    case 100:
      local_6f0 = CONCAT71(uVar7,1);
      goto LAB_00103e6f;
    case 0x65:
      local_728 = CONCAT71(uVar7,1);
      goto LAB_00103e6f;
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
switchD_001038d8_caseD_66:
      iVar8 = 1;
      anon_unknown.dwarf_393d::PrintUsage((ostream *)&std::cerr);
      iVar11 = 1;
      break;
    case 0x68:
      anon_unknown.dwarf_393d::PrintUsage((ostream *)&std::cout);
      iVar11 = 0;
      iVar8 = 1;
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_2b8,ya_optarg,(allocator *)&local_6a8);
      bVar4 = sptk::ConvertStringToInteger(&local_2b8,&local_738);
      bVar2 = 0 < local_738;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      if (bVar4 && bVar2) goto LAB_00103e6f;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b8,"The argument for the -l option must be a positive integer",
                 0x39);
      local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"vstat","");
      sptk::PrintErrorMessage(&local_6a8,(ostringstream *)&local_2b8);
      goto LAB_00103e1c;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_2b8,ya_optarg,(allocator *)&local_6a8);
      bVar2 = sptk::ConvertStringToInteger(&local_2b8,&local_738);
      bVar4 = -1 < local_738;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      if (bVar2 && bVar4) {
        local_738 = local_738 + 1;
        goto LAB_00103e6f;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b8,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b8,"non-negative integer",0x14);
      local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"vstat","");
      sptk::PrintErrorMessage(&local_6a8,(ostringstream *)&local_2b8);
      goto LAB_00103e1c;
    case 0x6f:
      std::__cxx11::string::string((string *)&local_2b8,ya_optarg,(allocator *)&local_6a8);
      bVar2 = sptk::ConvertStringToInteger(&local_2b8,(int *)local_470);
      if (bVar2) {
        bVar2 = sptk::IsInRange((OutputFormats)local_470[0]._M_dataplus._M_p,0,7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        if (!bVar2) goto LAB_00103c41;
        iVar8 = 4;
        bVar2 = true;
        local_730 = (OutputFormats)local_470[0]._M_dataplus._M_p;
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
LAB_00103c41:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2b8,"The argument for the -o option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2b8,"in the range of ",0x10);
        this = (ostream *)std::ostream::operator<<((ostream *)&local_2b8,0);
        std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
        std::ostream::operator<<((ostream *)this,7);
        local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"vstat","");
        sptk::PrintErrorMessage(&local_6a8,(ostringstream *)&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
          operator_delete(local_6a8._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b8);
        std::ios_base::~ios_base(local_248);
        iVar8 = 1;
        bVar2 = false;
        iVar11 = 1;
      }
      if (bVar2) goto LAB_00103e6f;
      break;
    case 0x73:
      if (iStack_6e0._M_current == local_6d8) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_6e8,iStack_6e0,
                   &ya_optarg);
      }
      else {
        *iStack_6e0._M_current = ya_optarg;
        iStack_6e0._M_current = iStack_6e0._M_current + 1;
      }
LAB_00103e6f:
      iVar8 = 0;
      break;
    case 0x74:
      std::__cxx11::string::string((string *)&local_2b8,ya_optarg,(allocator *)&local_6a8);
      bVar4 = sptk::ConvertStringToInteger(&local_2b8,&local_72c);
      bVar2 = 0 < local_72c;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      if (bVar4 && bVar2) goto LAB_00103e6f;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b8,"The argument for the -t option must be a positive integer",
                 0x39);
      local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"vstat","");
      sptk::PrintErrorMessage(&local_6a8,(ostringstream *)&local_2b8);
LAB_00103e1c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
        operator_delete(local_6a8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b8);
      std::ios_base::~ios_base(local_248);
      iVar8 = 1;
      iVar11 = 1;
      break;
    default:
      iVar8 = 2;
      if (iVar5 != -1) goto switchD_001038d8_caseD_66;
    }
    OVar1 = local_730;
  } while (iVar8 == 0);
  if (iVar8 != 2) goto LAB_0010413b;
  if ((local_72c == -1) || (local_6e8 == iStack_6e0._M_current)) {
    if (argc - ya_optind < 2) {
      if (argc == ya_optind) {
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar10 = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      if (bVar2) {
        local_700 = &local_2b8;
        std::ifstream::ifstream(local_700);
        if ((pcVar10 == (char *)0x0) ||
           (std::ifstream::open((char *)&local_2b8,(_Ios_Openmode)pcVar10),
           (abStack_298[*(long *)(local_2b8._M_dataplus._M_p + -0x18)] & 5) == 0)) {
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            local_700 = (string *)&std::cin;
          }
          uVar9 = 0;
          if (OVar1 < kNumOutputFormats) {
            if ((0x85U >> (OVar1 & 0x1f) & 1) == 0) {
              if ((0x48U >> (OVar1 & 0x1f) & 1) != 0) {
                uVar9 = 1;
              }
            }
            else {
              uVar9 = (undefined4)local_6f0;
            }
          }
          sptk::StatisticsAccumulation::StatisticsAccumulation
                    (&local_6c0,local_738 + -1,(OVar1 != kMean) + 1,(bool)((byte)uVar9 & 1),
                     (bool)((byte)local_728 & 1));
          sptk::StatisticsAccumulation::Buffer::Buffer(&local_b0);
          if (local_6c0.is_valid_ == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_6a8,"Failed to initialize StatisticsAccumulation",0x2b);
            local_470[0]._M_dataplus._M_p = (pointer)&local_470[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"vstat","");
            sptk::PrintErrorMessage(local_470,(ostringstream *)&local_6a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_470[0]._M_dataplus._M_p != &local_470[0].field_2) {
              operator_delete(local_470[0]._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6a8);
            std::ios_base::~ios_base(local_638);
            iVar11 = 1;
          }
          else {
            local_6d0 = iStack_6e0._M_current;
            bVar13 = local_6e8 == iStack_6e0._M_current;
            if (!(bool)bVar13) {
              local_728 = CONCAT44(local_728._4_4_,uVar9);
              ppcVar12 = local_6e8;
              do {
                pcVar10 = *ppcVar12;
                local_731 = bVar13;
                std::ifstream::ifstream(&local_6a8);
                std::ifstream::open((char *)&local_6a8,(_Ios_Openmode)pcVar10);
                if ((abStack_688[*(long *)(local_6a8._M_dataplus._M_p + -0x18)] & 5) == 0) {
                  std::vector<double,_std::allocator<double>_>::vector
                            (&local_488,(long)local_738,(allocator_type *)local_470);
                  std::vector<double,_std::allocator<double>_>::vector
                            (&local_4a0,(long)local_738,(allocator_type *)local_470);
                  sptk::SymmetricMatrix::SymmetricMatrix(&local_2f8,local_738);
                  do {
                    bVar2 = sptk::ReadStream<double>(&local_6c8,(istream *)&local_6a8);
                    if (!bVar2) goto LAB_001046f3;
                    bVar4 = sptk::ReadStream<double>
                                      (false,0,0,local_738,&local_488,(istream *)&local_6a8,
                                       (int *)0x0);
                    if (!bVar4) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_470,"Failed to read statistics (first order) in ",
                                 0x2b);
                      if (pcVar10 == (char *)0x0) {
                        std::ios::clear((int)&stack0xfffffffffffff8b8 +
                                        (int)*(undefined8 *)(local_470[0]._M_dataplus._M_p + -0x18)
                                        + 0x2d8);
                      }
                      else {
                        sVar6 = strlen(pcVar10);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_470,pcVar10,sVar6);
                      }
                      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_720,"vstat","");
                      sptk::PrintErrorMessage(&local_720,(ostringstream *)local_470);
                      goto LAB_001046b9;
                    }
                    if ((local_728 & 1) == 0) {
                      bVar4 = sptk::ReadStream(&local_2f8,(istream *)&local_6a8);
                      if (!bVar4) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_470,
                                   "Failed to read statistics (second order) in ",0x2c);
                        if (pcVar10 == (char *)0x0) {
                          std::ios::clear((int)&stack0xfffffffffffff8b8 +
                                          (int)*(undefined8 *)
                                                (local_470[0]._M_dataplus._M_p + -0x18) + 0x2d8);
                        }
                        else {
                          sVar6 = strlen(pcVar10);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_470,pcVar10,sVar6);
                        }
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_470," (expected full matrix)",0x17);
                        local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_720,"vstat","");
                        sptk::PrintErrorMessage(&local_720,(ostringstream *)local_470);
                        goto LAB_001046b9;
                      }
                    }
                    else {
                      bVar4 = sptk::ReadStream<double>
                                        (false,0,0,local_738,&local_4a0,(istream *)&local_6a8,
                                         (int *)0x0);
                      if ((!bVar4) ||
                         (bVar4 = sptk::SymmetricMatrix::SetDiagonal(&local_2f8,&local_4a0), !bVar4)
                         ) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_470,
                                   "Failed to read statistics (second order) in ",0x2c);
                        if (pcVar10 == (char *)0x0) {
                          std::ios::clear((int)&stack0xfffffffffffff8b8 +
                                          (int)*(undefined8 *)
                                                (local_470[0]._M_dataplus._M_p + -0x18) + 0x2d8);
                        }
                        else {
                          sVar6 = strlen(pcVar10);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_470,pcVar10,sVar6);
                        }
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_470," (expected diagonal matrix)",0x1b);
                        local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_720,"vstat","");
                        sptk::PrintErrorMessage(&local_720,(ostringstream *)local_470);
                        goto LAB_001046b9;
                      }
                    }
                    bVar4 = sptk::StatisticsAccumulation::Merge
                                      (&local_6c0,(int)local_6c8,&local_488,&local_2f8,&local_b0);
                  } while (bVar4);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_470,"Failed to merge statistics",0x1a);
                  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_720,"vstat_merge","");
                  sptk::PrintErrorMessage(&local_720,(ostringstream *)local_470);
LAB_001046b9:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_720._M_dataplus._M_p != &local_720.field_2) {
                    operator_delete(local_720._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
                  std::ios_base::~ios_base(local_400);
                  iVar11 = 1;
LAB_001046f3:
                  sptk::SymmetricMatrix::~SymmetricMatrix(&local_2f8);
                  if (local_4a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_4a0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_488.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  bVar2 = !bVar2;
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_470,"Cannot open file ",0x11);
                  if (pcVar10 == (char *)0x0) {
                    std::ios::clear((int)&stack0xfffffffffffff8b8 +
                                    (int)*(undefined8 *)(local_470[0]._M_dataplus._M_p + -0x18) +
                                    0x2d8);
                  }
                  else {
                    sVar6 = strlen(pcVar10);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_470,pcVar10,sVar6);
                  }
                  local_2f8._vptr_SymmetricMatrix = (_func_int **)&local_2f8.data_;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"vstat","");
                  sptk::PrintErrorMessage((string *)&local_2f8,(ostringstream *)local_470);
                  if ((vector<double,_std::allocator<double>_> *)local_2f8._vptr_SymmetricMatrix !=
                      &local_2f8.data_) {
                    operator_delete(local_2f8._vptr_SymmetricMatrix);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
                  std::ios_base::~ios_base(local_400);
                  iVar11 = 1;
                  bVar2 = false;
                }
                std::ifstream::~ifstream(&local_6a8);
                bVar13 = local_731;
                if (!bVar2) break;
                ppcVar12 = ppcVar12 + 1;
                bVar13 = ppcVar12 == local_6d0;
              } while (!(bool)bVar13);
            }
            if ((bVar13 & 1) != 0) {
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)&local_2f8,(long)local_738,
                         (allocator_type *)&local_6a8);
              iVar5 = 1;
              local_728 = CONCAT44(local_728._4_4_,(uint)(byte)local_6f0) & 0xffffffff00000001;
              while (bVar2 = sptk::ReadStream<double>
                                       (false,0,0,local_738,
                                        (vector<double,_std::allocator<double>_> *)&local_2f8,
                                        (istream *)local_700,(int *)0x0), bVar2) {
                bVar4 = sptk::StatisticsAccumulation::Run
                                  (&local_6c0,(vector<double,_std::allocator<double>_> *)&local_2f8,
                                   &local_b0);
                if (!bVar4) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_6a8,"Failed to accumulate statistics",0x1f);
                  local_470[0]._M_dataplus._M_p = (pointer)&local_470[0].field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"vstat","");
                  sptk::PrintErrorMessage(local_470,(ostringstream *)&local_6a8);
LAB_0010492a:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_470[0]._M_dataplus._M_p != &local_470[0].field_2) {
                    operator_delete(local_470[0]._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6a8);
                  std::ios_base::~ios_base(local_638);
                  iVar11 = 1;
                  break;
                }
                if ((local_72c != -1) && (iVar5 % local_72c == 0)) {
                  bVar4 = anon_unknown.dwarf_393d::OutputStatistics
                                    (&local_6c0,&local_b0,local_738,local_730,(double)local_6f8,
                                     SUB81(local_728,0));
                  if (!bVar4) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_6a8,"Failed to write statistics",0x1a);
                    local_470[0]._M_dataplus._M_p = (pointer)&local_470[0].field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"vstat","");
                    sptk::PrintErrorMessage(local_470,(ostringstream *)&local_6a8);
                    goto LAB_0010492a;
                  }
                  sptk::StatisticsAccumulation::Clear(&local_6c0,&local_b0);
                }
                iVar5 = iVar5 + 1;
              }
              if (!bVar2) {
                bVar2 = sptk::StatisticsAccumulation::GetNumData
                                  (&local_6c0,&local_b0,(int *)&local_720);
                if (bVar2) {
                  iVar11 = 0;
                  if (((local_72c != -1) || ((int)local_720._M_dataplus._M_p < 1)) ||
                     (bVar2 = anon_unknown.dwarf_393d::OutputStatistics
                                        (&local_6c0,&local_b0,local_738,local_730,(double)local_6f8,
                                         SUB81(local_728,0)), iVar11 = 0, bVar2)) goto LAB_00104ad3;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_6a8,"Failed to write statistics",0x1a);
                  local_470[0]._M_dataplus._M_p = (pointer)&local_470[0].field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"vstat","");
                  sptk::PrintErrorMessage(local_470,(ostringstream *)&local_6a8);
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_6a8,"Failed to accumulate statistics",0x1f);
                  local_470[0]._M_dataplus._M_p = (pointer)&local_470[0].field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"vstat","");
                  sptk::PrintErrorMessage(local_470,(ostringstream *)&local_6a8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_470[0]._M_dataplus._M_p != &local_470[0].field_2) {
                  operator_delete(local_470[0]._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6a8);
                std::ios_base::~ios_base(local_638);
                iVar11 = 1;
              }
LAB_00104ad3:
              if ((vector<double,_std::allocator<double>_> *)local_2f8._vptr_SymmetricMatrix !=
                  (vector<double,_std::allocator<double>_> *)0x0) {
                operator_delete(local_2f8._vptr_SymmetricMatrix);
              }
            }
          }
          sptk::StatisticsAccumulation::Buffer::~Buffer(&local_b0);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_6a8,"Cannot open file ",0x11);
          sVar6 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_6a8,pcVar10,sVar6);
          local_470[0]._M_dataplus._M_p = (pointer)&local_470[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"vstat","");
          sptk::PrintErrorMessage(local_470,(ostringstream *)&local_6a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_470[0]._M_dataplus._M_p != &local_470[0].field_2) {
            operator_delete(local_470[0]._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6a8);
          std::ios_base::~ios_base(local_638);
          iVar11 = 1;
        }
        std::ifstream::~ifstream(&local_2b8);
        goto LAB_0010413b;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b8,"Cannot set translation mode",0x1b);
      local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"vstat","");
      sptk::PrintErrorMessage(&local_6a8,(ostringstream *)&local_2b8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b8,"Too many input files",0x14);
      local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"vstat","");
      sptk::PrintErrorMessage(&local_6a8,(ostringstream *)&local_2b8);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"Cannot specify -t option and -s option at the same time",0x37)
    ;
    local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"vstat","");
    sptk::PrintErrorMessage(&local_6a8,(ostringstream *)&local_2b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b8);
  std::ios_base::~ios_base(local_248);
  iVar11 = 1;
LAB_0010413b:
  if (local_6e8 != (char **)0x0) {
    operator_delete(local_6e8);
  }
  return iVar11;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  int output_interval(kMagicNumberForEndOfFile);
  double confidence_level(kDefaultConfidenceLevel);
  OutputFormats output_format(kDefaultOutputFormat);
  std::vector<const char*> statistics_file;
  bool outputs_only_diagonal_elements(kDefaultOutputOnlyDiagonalElementsFlag);
  bool numerically_stable(kDefaultNumericallyStableFlag);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:t:c:o:s:deh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToDouble(optarg, &confidence_level) ||
            confidence_level <= 0.0 || 100.0 <= confidence_level) {
          std::ostringstream error_message;
          error_message << "The argument for the -c option must be a number "
                        << "in the open interval (0, 100)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 's': {
        statistics_file.push_back(optarg);
        break;
      }
      case 'd': {
        outputs_only_diagonal_elements = true;
        break;
      }
      case 'e': {
        numerically_stable = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (kMagicNumberForEndOfFile != output_interval && !statistics_file.empty()) {
    std::ostringstream error_message;
    error_message << "Cannot specify -t option and -s option at the same time";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  bool diagonal(false);
  if (kMeanAndCovariance == output_format || kCovariance == output_format ||
      kSufficientStatistics == output_format) {
    if (outputs_only_diagonal_elements) {
      diagonal = true;
    }
  } else if (kStandardDeviation == output_format ||
             kMeanAndLowerAndUpperBounds == output_format) {
    diagonal = true;
  }

  sptk::StatisticsAccumulation accumulation(vector_length - 1,
                                            kMean == output_format ? 1 : 2,
                                            diagonal, numerically_stable);
  sptk::StatisticsAccumulation::Buffer buffer;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  for (const char* file : statistics_file) {
    std::ifstream ifs2;
    ifs2.open(file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << file;
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }

    double num_data;
    std::vector<double> first(vector_length);
    std::vector<double> tmp(vector_length);
    sptk::SymmetricMatrix second(vector_length);
    while (sptk::ReadStream(&num_data, &ifs2)) {
      if (!sptk::ReadStream(false, 0, 0, vector_length, &first, &ifs2, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to read statistics (first order) in " << file;
        sptk::PrintErrorMessage("vstat", error_message);
        return 1;
      }

      if (diagonal) {
        if (!sptk::ReadStream(false, 0, 0, vector_length, &tmp, &ifs2, NULL) ||
            !second.SetDiagonal(tmp)) {
          std::ostringstream error_message;
          error_message << "Failed to read statistics (second order) in "
                        << file << " (expected diagonal matrix)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
      } else {
        if (!sptk::ReadStream(&second, &ifs2)) {
          std::ostringstream error_message;
          error_message << "Failed to read statistics (second order) in "
                        << file << " (expected full matrix)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
      }

      if (!accumulation.Merge(static_cast<int>(num_data), first, second,
                              &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to merge statistics";
        sptk::PrintErrorMessage("vstat_merge", error_message);
        return 1;
      }
    }
  }

  std::vector<double> data(vector_length);
  for (int vector_index(1);
       sptk::ReadStream(false, 0, 0, vector_length, &data, &input_stream, NULL);
       ++vector_index) {
    if (!accumulation.Run(data, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to accumulate statistics";
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }

    if (kMagicNumberForEndOfFile != output_interval &&
        0 == vector_index % output_interval) {
      if (!OutputStatistics(accumulation, buffer, vector_length, output_format,
                            confidence_level, outputs_only_diagonal_elements)) {
        std::ostringstream error_message;
        error_message << "Failed to write statistics";
        sptk::PrintErrorMessage("vstat", error_message);
        return 1;
      }
      accumulation.Clear(&buffer);
    }
  }

  int num_data;
  if (!accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  if (kMagicNumberForEndOfFile == output_interval && 0 < num_data) {
    if (!OutputStatistics(accumulation, buffer, vector_length, output_format,
                          confidence_level, outputs_only_diagonal_elements)) {
      std::ostringstream error_message;
      error_message << "Failed to write statistics";
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }
  }

  return 0;
}